

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauNpn.c
# Opt level: O0

void Dau_TruthEnum(int nVars)

{
  ulong uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int i_00;
  uint uVar5;
  int iVar6;
  abctime aVar7;
  int *__ptr;
  int *__ptr_00;
  ulong uVar8;
  word *p;
  void *__ptr_01;
  Vec_Int_t *p_00;
  word wVar9;
  abctime aVar10;
  FILE *__s;
  byte bVar11;
  char local_158 [8];
  char pFileName [200];
  int RetValue;
  FILE *pFile;
  int k;
  int i;
  word tCur;
  word tTemp;
  word tMask;
  Vec_Int_t *vNpns;
  uint *pTable;
  word *pPres;
  word nFuncs;
  int *pComp;
  int *pPerm;
  int nMints;
  int nPerms;
  int nSizeW;
  int nSizeLog;
  abctime clk;
  int fUseTable;
  int nVars_local;
  
  aVar7 = Abc_Clock();
  bVar11 = (byte)nVars;
  uVar2 = (1 << (bVar11 & 0x1f)) - 2;
  iVar3 = 1 << ((byte)uVar2 & 0x1f);
  iVar4 = Extra_Factorial(nVars);
  __ptr = Extra_PermSchedule(nVars);
  __ptr_00 = Extra_GreyCodeSchedule(nVars);
  uVar8 = 1L << ((char)(1L << (bVar11 & 0x3f)) - 1U & 0x3f);
  p = (word *)calloc((long)(1 << ((char)(1 << (bVar11 & 0x1f)) - 7U & 0x1f)),8);
  __ptr_01 = calloc((long)iVar3,8);
  p_00 = Vec_IntAlloc(1000);
  wVar9 = Abc_Tt6Mask(1 << (bVar11 & 0x1f));
  if (p == (word *)0x0) {
    printf("Cannot alloc memory for marks.\n");
  }
  else {
    if (__ptr_01 == (void *)0x0) {
      printf("Cannot alloc memory for table.\n");
    }
    for (_k = 0; uVar1 = _k, _k < uVar8; _k = _k + 1) {
      i_00 = (int)_k;
      if ((_k & 0x3ffff) == 0) {
        uVar5 = Vec_IntSize(p_00);
        printf("Finished %08x.  Classes = %6d.  ",_k & 0xffffffff,(ulong)uVar5);
        aVar10 = Abc_Clock();
        Abc_PrintTime(1,"Time",aVar10 - aVar7);
        fflush(_stdout);
      }
      iVar6 = Abc_TtGetBit(p,i_00);
      if (iVar6 == 0) {
        Vec_IntPush(p_00,i_00);
        for (pFile._4_4_ = 0; pFile._4_4_ < iVar4; pFile._4_4_ = pFile._4_4_ + 1) {
          for (pFile._0_4_ = 0; (int)pFile < 1 << (bVar11 & 0x1f); pFile._0_4_ = (int)pFile + 1) {
            uVar5 = (uint)_k;
            if (_k < uVar8) {
              if (__ptr_01 != (void *)0x0) {
                *(int *)((long)__ptr_01 + (long)(int)uVar5 * 4) = i_00;
              }
              Abc_TtSetBit(p,uVar5);
            }
            if ((wVar9 & (_k ^ 0xffffffffffffffff)) < uVar8) {
              if (__ptr_01 != (void *)0x0) {
                *(int *)((long)__ptr_01 + (long)(int)((uint)wVar9 & (uVar5 ^ 0xffffffff)) * 4) =
                     i_00;
              }
              Abc_TtSetBit(p,(uint)wVar9 & (uVar5 ^ 0xffffffff));
            }
            _k = Abc_Tt6Flip(_k,__ptr_00[(int)pFile]);
          }
          _k = Abc_Tt6SwapAdjacent(_k,__ptr[pFile._4_4_]);
        }
        if (uVar1 != _k) {
          __assert_fail("tTemp == tCur",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauNpn.c"
                        ,0x68,"void Dau_TruthEnum(int)");
        }
      }
    }
    uVar5 = Vec_IntSize(p_00);
    printf("Computed %d NPN classes of %d variables.  ",(ulong)uVar5,(ulong)(uint)nVars);
    aVar10 = Abc_Clock();
    Abc_PrintTime(1,"Time",aVar10 - aVar7);
    fflush(_stdout);
    Vec_IntFree(p_00);
    if (p != (word *)0x0) {
      free(p);
    }
    if (__ptr != (int *)0x0) {
      free(__ptr);
    }
    if (__ptr_00 != (int *)0x0) {
      free(__ptr_00);
    }
    if (__ptr_01 != (void *)0x0) {
      sprintf(local_158,"tableW%d.data",(ulong)uVar2);
      __s = fopen(local_158,"wb");
      fwrite(__ptr_01,8,(long)iVar3,__s);
      fclose(__s);
      if (__ptr_01 != (void *)0x0) {
        free(__ptr_01);
      }
    }
  }
  return;
}

Assistant:

ABC_NAMESPACE_IMPL_START

////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////


////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////
 
/**Function*************************************************************

  Synopsis    []

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Dau_TruthEnum(int nVars)
{
    int fUseTable = 1;
    abctime clk = Abc_Clock();
    int nSizeLog = (1<<nVars) -2;
    int nSizeW = 1 << nSizeLog;
    int nPerms  = Extra_Factorial( nVars );
    int nMints  = 1 << nVars;
    int * pPerm = Extra_PermSchedule( nVars );
    int * pComp = Extra_GreyCodeSchedule( nVars );
    word nFuncs = ((word)1 << (((word)1 << nVars)-1));
    word * pPres = ABC_CALLOC( word, 1 << ((1<<nVars)-7) );
    unsigned * pTable = fUseTable ? (unsigned *)ABC_CALLOC(word, nSizeW) : NULL;
    Vec_Int_t * vNpns = Vec_IntAlloc( 1000 );
    word tMask = Abc_Tt6Mask( 1 << nVars );
    word tTemp, tCur;
    int i, k;
    if ( pPres == NULL )
    {
        printf( "Cannot alloc memory for marks.\n" );
        return;
    }
    if ( pTable == NULL )
        printf( "Cannot alloc memory for table.\n" );
    for ( tCur = 0; tCur < nFuncs; tCur++ )
    {
        if ( (tCur & 0x3FFFF) == 0 )
        {
            printf( "Finished %08x.  Classes = %6d.  ", (int)tCur, Vec_IntSize(vNpns) );
            Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
            fflush(stdout);
        }
        if ( Abc_TtGetBit(pPres, (int)tCur) )
            continue;
        //Extra_PrintBinary( stdout, (unsigned *)&tCur, 16 ); printf( " %04x\n", (int)tCur );
        //Dau_DsdPrintFromTruth( &tCur, 4 ); printf( "\n" );
        Vec_IntPush( vNpns, (int)tCur );
        tTemp = tCur;
        for ( i = 0; i < nPerms; i++ )
        {
            for ( k = 0; k < nMints; k++ )
            {
                if ( tCur < nFuncs )
                {
                    if ( pTable ) pTable[(int)tCur] = tTemp;
                    Abc_TtSetBit( pPres, (int)tCur );
                }
                if ( (tMask & ~tCur) < nFuncs )
                {
                    if ( pTable ) pTable[(int)(tMask & ~tCur)] = tTemp;
                    Abc_TtSetBit( pPres, (int)(tMask & ~tCur) );
                }
                tCur = Abc_Tt6Flip( tCur, pComp[k] );
            }
            tCur = Abc_Tt6SwapAdjacent( tCur, pPerm[i] );
        }
        assert( tTemp == tCur );
    }
    printf( "Computed %d NPN classes of %d variables.  ", Vec_IntSize(vNpns), nVars );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    fflush(stdout);
    Vec_IntFree( vNpns );
    ABC_FREE( pPres );
    ABC_FREE( pPerm );
    ABC_FREE( pComp );
    // write into file
    if ( pTable )
    {
        FILE * pFile;
        int RetValue;
        char pFileName[200];
        sprintf( pFileName, "tableW%d.data", nSizeLog );
        pFile = fopen( pFileName, "wb" );
        RetValue = fwrite( pTable, 8, nSizeW, pFile );
        RetValue = 0;
        fclose( pFile );
        ABC_FREE( pTable );
    }
}